

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int64_t finer_search_pixel_proj_error
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int use_highbitdepth,int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,
                  int start_step,int *xqd,sgr_params_type *params)

{
  int width_00;
  int in_EDX;
  undefined8 unaff_RBX;
  int *unaff_RBP;
  int32_t *in_RDI;
  int32_t *unaff_R14;
  undefined8 unaff_R15;
  sgr_params_type *unaff_retaddr;
  int in_stack_00000030;
  long in_stack_00000038;
  int *in_stack_00000040;
  int skip;
  int p;
  int s;
  int tap_max [2];
  int tap_min [2];
  int64_t err2;
  int64_t err;
  int dat_stride_00;
  uint8_t *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  int iVar1;
  int in_stack_ffffffffffffff90;
  int height_00;
  int in_stack_ffffffffffffff94;
  uint8_t *in_stack_ffffffffffffff98;
  uint8_t *src8_00;
  int local_60 [2];
  int64_t local_58;
  int64_t local_50;
  
  dat_stride_00 = (int)((ulong)in_stack_00000040 >> 0x20);
  local_50 = get_pixel_proj_error
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                        in_stack_ffffffffffffff80,dat_stride_00,in_EDX,in_RDI,(int)unaff_RBX,
                        unaff_R14,(int)unaff_R15,unaff_RBP,unaff_retaddr);
  local_60[0] = -0x60;
  local_60[1] = -0x20;
  src8_00 = (uint8_t *)0x5f0000001f;
  width_00 = in_stack_00000030;
  do {
    if (width_00 < 1) {
      return local_50;
    }
    for (height_00 = 0; height_00 < 2; height_00 = height_00 + 1) {
      if (((*in_stack_00000040 != 0) || (height_00 != 0)) &&
         ((in_stack_00000040[1] != 0 || (height_00 != 1)))) {
        iVar1 = 0;
        do {
          if (*(int *)(in_stack_00000038 + (long)height_00 * 4) - width_00 < local_60[height_00])
          break;
          *(int *)(in_stack_00000038 + (long)height_00 * 4) =
               *(int *)(in_stack_00000038 + (long)height_00 * 4) - width_00;
          local_58 = get_pixel_proj_error
                               (src8_00,width_00,height_00,iVar1,in_stack_ffffffffffffff80,
                                dat_stride_00,in_EDX,in_RDI,(int)unaff_RBX,unaff_R14,(int)unaff_R15,
                                unaff_RBP,unaff_retaddr);
          if (local_50 < local_58) {
            *(int *)(in_stack_00000038 + (long)height_00 * 4) =
                 width_00 + *(int *)(in_stack_00000038 + (long)height_00 * 4);
            break;
          }
          local_50 = local_58;
          iVar1 = 1;
        } while (width_00 == in_stack_00000030);
        if (iVar1 != 0) break;
        iVar1 = 0;
        do {
          if (*(int *)(&stack0xffffffffffffff98 + (long)height_00 * 4) <
              *(int *)(in_stack_00000038 + (long)height_00 * 4) + width_00) break;
          *(int *)(in_stack_00000038 + (long)height_00 * 4) =
               width_00 + *(int *)(in_stack_00000038 + (long)height_00 * 4);
          local_58 = get_pixel_proj_error
                               (src8_00,width_00,height_00,iVar1,in_stack_ffffffffffffff80,
                                dat_stride_00,in_EDX,in_RDI,(int)unaff_RBX,unaff_R14,(int)unaff_R15,
                                unaff_RBP,unaff_retaddr);
          if (local_50 < local_58) {
            *(int *)(in_stack_00000038 + (long)height_00 * 4) =
                 *(int *)(in_stack_00000038 + (long)height_00 * 4) - width_00;
            break;
          }
          local_50 = local_58;
        } while (width_00 == in_stack_00000030);
      }
    }
    width_00 = width_00 >> 1;
  } while( true );
}

Assistant:

static int64_t finer_search_pixel_proj_error(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int use_highbitdepth, int32_t *flt0,
    int flt0_stride, int32_t *flt1, int flt1_stride, int start_step, int *xqd,
    const sgr_params_type *params) {
  int64_t err = get_pixel_proj_error(
      src8, width, height, src_stride, dat8, dat_stride, use_highbitdepth, flt0,
      flt0_stride, flt1, flt1_stride, xqd, params);
  (void)start_step;
#if USE_SGRPROJ_REFINEMENT_SEARCH
  int64_t err2;
  int tap_min[] = { SGRPROJ_PRJ_MIN0, SGRPROJ_PRJ_MIN1 };
  int tap_max[] = { SGRPROJ_PRJ_MAX0, SGRPROJ_PRJ_MAX1 };
  for (int s = start_step; s >= 1; s >>= 1) {
    for (int p = 0; p < 2; ++p) {
      if ((params->r[0] == 0 && p == 0) || (params->r[1] == 0 && p == 1)) {
        continue;
      }
      int skip = 0;
      do {
        if (xqd[p] - s >= tap_min[p]) {
          xqd[p] -= s;
          err2 =
              get_pixel_proj_error(src8, width, height, src_stride, dat8,
                                   dat_stride, use_highbitdepth, flt0,
                                   flt0_stride, flt1, flt1_stride, xqd, params);
          if (err2 > err) {
            xqd[p] += s;
          } else {
            err = err2;
            skip = 1;
            // At the highest step size continue moving in the same direction
            if (s == start_step) continue;
          }
        }
        break;
      } while (1);
      if (skip) break;
      do {
        if (xqd[p] + s <= tap_max[p]) {
          xqd[p] += s;
          err2 =
              get_pixel_proj_error(src8, width, height, src_stride, dat8,
                                   dat_stride, use_highbitdepth, flt0,
                                   flt0_stride, flt1, flt1_stride, xqd, params);
          if (err2 > err) {
            xqd[p] -= s;
          } else {
            err = err2;
            // At the highest step size continue moving in the same direction
            if (s == start_step) continue;
          }
        }
        break;
      } while (1);
    }
  }
#endif  // USE_SGRPROJ_REFINEMENT_SEARCH
  return err;
}